

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O2

void __thiscall rtosc::AutomationMgr::updateMapping(AutomationMgr *this,int slot_id,int sub)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Automation *pAVar4;
  float *pfVar5;
  float fVar6;
  
  if ((((-1 < slot_id) && (slot_id < this->nslots)) && (-1 < sub)) && (sub < this->per_slot)) {
    pAVar4 = this->slots[(uint)slot_id].automations;
    fVar1 = pAVar4[(uint)sub].param_min;
    fVar2 = pAVar4[(uint)sub].param_max;
    fVar6 = (pAVar4[(uint)sub].map.offset / 100.0 + 0.5) * (fVar1 + fVar2);
    fVar3 = pAVar4[(uint)sub].map.gain;
    pAVar4[(uint)sub].map.upoints = 2;
    pfVar5 = pAVar4[(uint)sub].map.control_points;
    *pfVar5 = 0.0;
    fVar1 = (((fVar2 - fVar1) * fVar3) / 100.0) * 0.5;
    pfVar5[1] = fVar6 - fVar1;
    pfVar5[2] = 1.0;
    pfVar5[3] = fVar1 + fVar6;
  }
  return;
}

Assistant:

void AutomationMgr::updateMapping(int slot_id, int sub)
{
    if(slot_id >= nslots || slot_id < 0 || sub >= per_slot || sub < 0)
        return;


    auto &au = slots[slot_id].automations[sub];

    float mn = au.param_min;
    float mx = au.param_max;
    float center = (mn+mx)*(0.5 + au.map.offset/100.0);
    float range  = (mx-mn)*au.map.gain/100.0;

    au.map.upoints = 2;
    au.map.control_points[0] = 0;
    au.map.control_points[1] = center-range/2.0;
    au.map.control_points[2] = 1;
    au.map.control_points[3] = center+range/2.0;
}